

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
* __thiscall
cimod::BinaryPolynomialModel<std::tuple<unsigned_long,_unsigned_long>,_double>::
GenerateSortedVariables
          (vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
           *__return_storage_ptr__,
          BinaryPolynomialModel<std::tuple<unsigned_long,_unsigned_long>,_double> *this)

{
  pointer ptVar1;
  pointer ptVar2;
  long lVar3;
  ulong uVar4;
  allocator_type local_19;
  
  std::
  vector<std::tuple<unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long>>>
  ::
  vector<std::__detail::_Node_const_iterator<std::tuple<unsigned_long,unsigned_long>,true,true>,void>
            ((vector<std::tuple<unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long>>>
              *)__return_storage_ptr__,
             (_Node_const_iterator<std::tuple<unsigned_long,_unsigned_long>,_true,_true>)
             (this->variables_)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<std::tuple<unsigned_long,_unsigned_long>,_true,_true>)0x0,
             &local_19);
  ptVar1 = (__return_storage_ptr__->
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar2 = (__return_storage_ptr__->
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar1 != ptVar2) {
    uVar4 = (long)ptVar2 - (long)ptVar1 >> 4;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long>*,std::vector<std::tuple<unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ptVar1,ptVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long>*,std::vector<std::tuple<unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ptVar1,ptVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IndexType> GenerateSortedVariables() const {
      std::vector<IndexType> sorted_variables( variables_.begin(), variables_.end() );
      std::sort( sorted_variables.begin(), sorted_variables.end() );
      return sorted_variables;
    }